

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int decompress16(DUMBFILE *f,short *data,int len,int it215,int stereo)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  short *in_RSI;
  int in_R8D;
  byte shift;
  short v;
  word border;
  readblock_crap crap;
  short d2;
  short d1;
  int32 val;
  byte bitwidth;
  int blockpos;
  int blocklen;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  short local_5c;
  readblock_crap local_58;
  short local_38;
  short local_36;
  uint local_34;
  byte local_2d;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  short *local_18;
  
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  memset(&local_58,0,0x20);
  local_2c = 0;
  for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
    local_18[local_2c] = 0;
    local_2c = local_24 + 1 + local_2c;
  }
  do {
    if (local_1c < 1) {
      return 0;
    }
    iVar3 = readblock((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (readblock_crap *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (iVar3 != 0) {
      return -1;
    }
    in_stack_ffffffffffffff9c = local_1c;
    if (0x3fff < local_1c) {
      in_stack_ffffffffffffff9c = 0x4000;
    }
    local_2c = 0;
    local_2d = 0x11;
    local_38 = 0;
    local_36 = 0;
    local_28 = in_stack_ffffffffffffff9c;
    while (local_2c < local_28) {
      local_34 = readbits((uint)local_2d,&local_58);
      if (local_2d < 7) {
        if (local_34 == 1 << (local_2d - 1 & 0x1f)) {
          iVar3 = readbits(4,&local_58);
          local_34 = iVar3 + 1;
          in_stack_ffffffffffffff98 = local_34;
          if ((int)(uint)local_2d <= (int)local_34) {
            in_stack_ffffffffffffff98 = iVar3 + 2;
          }
          local_2d = (byte)in_stack_ffffffffffffff98;
        }
        else {
LAB_00867a3c:
          if (local_2d < 0x10) {
            local_5c = (short)((int)(short)(local_34 << (0x10 - local_2d & 0x1f)) >>
                              (0x10 - local_2d & 0x1f));
          }
          else {
            local_5c = (short)local_34;
          }
          local_36 = local_36 + local_5c;
          local_38 = local_38 + local_36;
          sVar2 = local_36;
          if (local_20 != 0) {
            sVar2 = local_38;
          }
          in_stack_ffffffffffffff90 = (int)sVar2;
          *local_18 = sVar2;
          local_18 = local_18 + (long)local_24 + 1;
          local_1c = local_1c + -1;
          local_2c = local_2c + 1;
        }
      }
      else if (local_2d < 0x11) {
        uVar1 = (short)(0xffff >> (0x11 - local_2d & 0x1f)) - 8;
        if (((int)local_34 <= (int)(uint)uVar1) || ((int)(uVar1 + 0x10) < (int)local_34))
        goto LAB_00867a3c;
        local_34 = local_34 - uVar1;
        in_stack_ffffffffffffff94 = local_34;
        if ((int)(uint)local_2d <= (int)local_34) {
          in_stack_ffffffffffffff94 = local_34 + 1;
        }
        local_2d = (byte)in_stack_ffffffffffffff94;
      }
      else {
        if (local_2d != 0x11) {
          freeblock((readblock_crap *)0x867a2b);
          return -1;
        }
        if ((local_34 & 0x10000) == 0) goto LAB_00867a3c;
        local_2d = (char)local_34 + 1;
      }
    }
    freeblock((readblock_crap *)0x867b16);
  } while( true );
}

Assistant:

static int decompress16(DUMBFILE *f, short *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	int32 val;
	short d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for ( blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo )
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x4000) ? len : 0x4000; // Max block length is 0x4000 bytes
		blockpos = 0;
		bitwidth = 17;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			val = readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = readbits(4, &crap) + 1;
					bitwidth = (byte)((val < bitwidth) ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth < 17) { //Method 2
				word border = (0xFFFF >> (17 - bitwidth)) - 8;

				if (val > border && val <= (border + 16)) {
					val -= border;
					bitwidth = (byte)(val < bitwidth ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth == 17) { //Method 3
				if (val & 0x10000) {
					bitwidth = (byte)((val + 1) & 0xFF);
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				short v; //The sample value:
				if (bitwidth < 16) {
					byte shift = 16 - bitwidth;
					v = (short)(val << shift);
					v >>= shift;
				}
				else
					v = (short)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}